

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDToBrepParameters::Compare(ON_SubDToBrepParameters *lhs,ON_SubDToBrepParameters *rhs)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((rhs->m_bPackFaces <= lhs->m_bPackFaces) &&
     (uVar1 = 1, lhs->m_bPackFaces <= rhs->m_bPackFaces)) {
    uVar1 = 0xffffffff;
    if (rhs->m_extraordinary_vertex_process <= lhs->m_extraordinary_vertex_process) {
      uVar1 = (uint)(rhs->m_extraordinary_vertex_process < lhs->m_extraordinary_vertex_process);
    }
  }
  return uVar1;
}

Assistant:

int ON_SubDToBrepParameters::Compare(
  const ON_SubDToBrepParameters& lhs,
  const ON_SubDToBrepParameters& rhs
)
{
  unsigned int a = lhs.m_bPackFaces ? 1 : 0;
  unsigned int b = rhs.m_bPackFaces ? 1 : 0;
  if (a < b)
    return -1;
  if (a > b)
    return 1;

  a = static_cast<unsigned char>(lhs.m_extraordinary_vertex_process);
  b = static_cast<unsigned char>(rhs.m_extraordinary_vertex_process);
  if (a < b)
    return -1;
  if (a > b)
    return 1;

  return 0;
}